

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::initNgrams(Dictionary *this)

{
  pointer peVar1;
  long lVar2;
  iterator __position;
  long lVar3;
  ulong uVar4;
  subentry sl;
  subentry sm;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [24];
  
  if (this->size_ != 0) {
    lVar3 = 0x60;
    uVar4 = 0;
    do {
      peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)((long)peVar1 + lVar3 + -0x30);
      if (*(long *)((long)peVar1 + lVar3 + -0x28) != lVar2) {
        *(long *)((long)peVar1 + lVar3 + -0x28) = lVar2;
      }
      local_80 = (undefined1 *)CONCAT44(local_80._4_4_,(int)uVar4);
      __position._M_current = *(int **)((long)peVar1 + lVar3 + -0x28);
      if (__position._M_current == *(int **)((long)peVar1 + lVar3 + -0x20)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)((long)peVar1 + lVar3 + -0x30),__position,
                   (int *)&local_80);
      }
      else {
        *__position._M_current = (int)uVar4;
        *(int **)((long)peVar1 + lVar3 + -0x28) = __position._M_current + 1;
      }
      local_78 = 0;
      local_70[0] = 0;
      local_58 = local_48;
      local_50 = 0;
      local_48[0] = 0;
      peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_80 = local_70;
      std::__cxx11::string::_M_assign((string *)((long)&(peVar1->word).field_2 + lVar3 + 8U));
      *(undefined8 *)
       ((long)&(peVar1->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar3 + 8)
           = local_60;
      peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      computeNgrams(this,(string *)
                         ((long)&(peVar1->subngram).
                                 super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>
                                 ._M_impl + lVar3 + 0x10),
                    (vector<int,_std::allocator<int>_> *)((long)peVar1 + lVar3 + -0x30),
                    (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                    ((long)peVar1 + lVar3 + -0x18),
                    (subentry *)((long)&(peVar1->word).field_2 + lVar3 + 8U),
                    (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                    ((long)&(peVar1->subwords).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    + lVar3 + 0x10),
                    (vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                    ((long)&(peVar1->word)._M_dataplus._M_p + lVar3));
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0xd8;
    } while (uVar4 < (ulong)(long)this->size_);
  }
  return;
}

Assistant:

void Dictionary::initNgrams() {
  for (size_t i = 0; i < size_; i++) {
  	 words_[i].subwords.clear();
 	 words_[i].subwords.push_back(i);
	 subentry sl;
	 subentry sm;
         words_[i].sublemma = sl;
   	 computeNgrams(words_[i].actual_word, words_[i].subwords, words_[i].subngram,words_[i].sublemma,words_[i].submorph,words_[i].subipangram);
  }
}